

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::XmlUnitTestResultPrinter::XmlUnitTestResultPrinter
          (XmlUnitTestResultPrinter *this,char *output_file)

{
  GTestLog local_20;
  allocator local_19;
  
  (this->super_EmptyTestEventListener).super_TestEventListener._vptr_TestEventListener =
       (_func_int **)&PTR__XmlUnitTestResultPrinter_001fa0a0;
  std::__cxx11::string::string((string *)&this->output_file_,output_file,&local_19);
  if ((this->output_file_)._M_string_length == 0) {
    GTestLog::GTestLog(&local_20,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/build_O2/tests/googletest-prefix/src/googletest/googletest/src/gtest.cc"
                       ,0xf87);
    std::operator<<((ostream *)&std::cerr,"XML output file may not be null");
    GTestLog::~GTestLog(&local_20);
  }
  return;
}

Assistant:

XmlUnitTestResultPrinter::XmlUnitTestResultPrinter(const char* output_file)
    : output_file_(output_file) {
  if (output_file_.empty()) {
    GTEST_LOG_(FATAL) << "XML output file may not be null";
  }
}